

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O3

bool __thiscall
cmFindBase::ParseArguments
          (cmFindBase *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *argsIn)

{
  cmFindCommon *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  cmMakefile *this_01;
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  string_view name;
  bool bVar3;
  bool bVar4;
  int iVar5;
  optional<cmWindowsRegistry::View> oVar6;
  cmState *this_02;
  string *psVar7;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var8;
  long *plVar9;
  value_type *pvVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  pointer pbVar14;
  ulong uVar15;
  undefined4 uVar16;
  long lVar17;
  anon_class_8_1_d1845f1d_for__M_pred __pred;
  cmFindBase *this_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  string_view separator;
  Command command;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  cmList macros;
  _Any_data local_108;
  _Alloc_hider in_stack_ffffffffffffff08;
  _Alloc_hider _Var18;
  char *in_stack_ffffffffffffff10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  undefined8 local_d8;
  cmFindCommon *local_c8;
  undefined1 local_c0 [32];
  string *local_a0;
  long local_98;
  cmFindBase *local_90;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_58;
  string *local_50;
  cmList local_48;
  
  uVar15 = (long)(argsIn->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(argsIn->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 5;
  if (uVar15 < 2) {
    local_108._M_unused._M_object = &stack0xffffffffffffff08;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"called with incorrect number of arguments","");
    cmFindCommon::SetError(&this->super_cmFindCommon,(string *)&local_108);
    if ((undefined1 *)local_108._M_unused._0_8_ != &stack0xffffffffffffff08) {
      operator_delete(local_108._M_unused._M_object,(ulong)(in_stack_ffffffffffffff08._M_p + 1));
    }
    bVar3 = false;
  }
  else {
    local_e8._M_allocated_capacity = 0;
    local_e8._8_8_ = 0;
    local_d8 = 0;
    local_a0 = (string *)&this->VariableDocumentation;
    uVar13 = 0;
    bVar3 = false;
    uVar12 = 0;
    local_90 = this;
    do {
      pbVar14 = (argsIn->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if (bVar3) {
LAB_005aadaf:
        iVar5 = std::__cxx11::string::compare((char *)(pbVar14 + uVar13));
        if (iVar5 == 0) {
          local_90->StoreResultInCache = false;
        }
        else {
          iVar5 = std::__cxx11::string::compare
                            ((char *)((argsIn->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar13));
          if (iVar5 == 0) {
            uVar11 = uVar12 + 1;
            if (uVar11 < uVar15) {
              cmsys::SystemTools::GetPath
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_e8,
                         (argsIn->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start[uVar11]._M_dataplus._M_p);
              uVar12 = uVar11;
            }
          }
          else {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_e8,
                        (argsIn->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + uVar13);
          }
        }
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)(pbVar14 + uVar13));
        if (iVar5 != 0) {
          pbVar14 = (argsIn->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          goto LAB_005aadaf;
        }
        if (uVar12 + 1 < uVar15) {
          bVar3 = true;
          std::__cxx11::string::_M_assign(local_a0);
          uVar12 = uVar12 + 1;
        }
        else {
          bVar3 = false;
        }
      }
      this_03 = local_90;
      uVar12 = uVar12 + 1;
      uVar13 = (ulong)uVar12;
    } while (uVar13 < uVar15);
    if ((ulong)(local_e8._8_8_ - local_e8._0_8_) < 0x21) {
      local_108._M_unused._M_object = &stack0xffffffffffffff08;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_108,"called with incorrect number of arguments","");
      cmFindCommon::SetError(&local_90->super_cmFindCommon,(string *)&local_108);
LAB_005aae92:
      if ((value_type *)local_108._M_unused._0_8_ != (value_type *)&stack0xffffffffffffff08) {
LAB_005aae9b:
        operator_delete(local_108._M_unused._M_object,(ulong)(in_stack_ffffffffffffff08._M_p + 1));
      }
LAB_005aaea8:
      bVar3 = false;
    }
    else {
      std::__cxx11::string::_M_assign((string *)&local_90->VariableName);
      bVar3 = CheckForVariableDefined(this_03);
      if (bVar3) {
        this_03->AlreadyDefined = true;
        bVar3 = true;
      }
      else {
        this_00 = &this_03->super_cmFindCommon;
        cmFindCommon::SelectDefaultSearchModes(this_00);
        cmFindCommon::SelectDefaultRootPathMode(this_00);
        cmFindCommon::SelectDefaultMacMode(this_00);
        local_c8 = this_00;
        if ((ulong)(local_e8._8_8_ - local_e8._0_8_) < 0x21) {
          bVar3 = false;
        }
        else {
          local_58 = &(this_03->super_cmFindCommon).UserGuessArgs;
          local_60 = &this_03->Names;
          local_50 = (string *)&this_03->ValidatorName;
          uVar16 = 1;
          uVar15 = 1;
          bVar3 = false;
          do {
            uVar12 = (uint)uVar15;
            lVar17 = uVar15 * 0x20;
            iVar5 = std::__cxx11::string::compare((char *)(local_e8._M_allocated_capacity + lVar17))
            ;
            if (iVar5 == 0) {
              uVar16 = 1;
LAB_005ab0bc:
              bVar3 = true;
            }
            else {
              iVar5 = std::__cxx11::string::compare
                                ((char *)(local_e8._M_allocated_capacity + lVar17));
              if (iVar5 == 0) {
                uVar16 = 2;
                goto LAB_005ab0bc;
              }
              iVar5 = std::__cxx11::string::compare
                                ((char *)(local_e8._M_allocated_capacity + lVar17));
              if (iVar5 == 0) {
                uVar16 = 4;
                goto LAB_005ab0bc;
              }
              iVar5 = std::__cxx11::string::compare
                                ((char *)(local_e8._M_allocated_capacity + lVar17));
              if (iVar5 == 0) {
                uVar16 = 3;
                goto LAB_005ab0bc;
              }
              iVar5 = std::__cxx11::string::compare
                                ((char *)(local_e8._M_allocated_capacity + lVar17));
              if (iVar5 == 0) {
                if (this_03->NamesPerDirAllowed != true) {
                  local_108._M_unused._M_object = &stack0xffffffffffffff08;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_108,"does not support NAMES_PER_DIR","");
                  cmFindCommon::SetError(local_c8,(string *)&local_108);
                  goto LAB_005aae92;
                }
                this_03->NamesPerDir = true;
LAB_005ab100:
                uVar16 = 0;
              }
              else {
                iVar5 = std::__cxx11::string::compare
                                  ((char *)(local_e8._M_allocated_capacity + lVar17));
                if (iVar5 == 0) {
                  (this_03->super_cmFindCommon).NoDefaultPath = true;
                  goto LAB_005ab100;
                }
                iVar5 = std::__cxx11::string::compare
                                  ((char *)(local_e8._M_allocated_capacity + lVar17));
                if (iVar5 == 0) {
                  this_03->Required = true;
                  uVar16 = 0;
                  goto LAB_005ab0bc;
                }
                iVar5 = std::__cxx11::string::compare
                                  ((char *)(local_e8._M_allocated_capacity + lVar17));
                if (iVar5 == 0) {
                  uVar12 = uVar12 + 1;
                  if ((long)(local_e8._8_8_ - local_e8._0_8_) >> 5 == (ulong)uVar12) {
                    local_108._M_unused._M_object = &stack0xffffffffffffff08;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_108,
                               "missing required argument for \"REGISTRY_VIEW\"","");
                    cmFindCommon::SetError(local_c8,(string *)&local_108);
                    goto LAB_005aae92;
                  }
                  name._M_str = in_stack_ffffffffffffff10;
                  name._M_len = (size_t)in_stack_ffffffffffffff08._M_p;
                  oVar6 = cmWindowsRegistry::ToView(name);
                  if (((ulong)oVar6.super__Optional_base<cmWindowsRegistry::View,_true,_true>.
                              _M_payload.super__Optional_payload_base<cmWindowsRegistry::View> >>
                       0x20 & 1) == 0) {
                    cmStrCat<char_const(&)[42],std::__cxx11::string&>
                              ((string *)&local_108,
                               (char (*) [42])"given invalid value for \"REGISTRY_VIEW\": ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((ulong)uVar12 * 0x20 + local_e8._M_allocated_capacity));
                    cmFindCommon::SetError(local_c8,(string *)&local_108);
                    if ((value_type *)local_108._M_unused._0_8_ ==
                        (value_type *)&stack0xffffffffffffff08) goto LAB_005aaea8;
                    goto LAB_005aae9b;
                  }
                  (this_03->super_cmFindCommon).RegistryView =
                       oVar6.super__Optional_base<cmWindowsRegistry::View,_true,_true>._M_payload.
                       super__Optional_payload_base<cmWindowsRegistry::View>._M_payload;
                }
                else {
                  iVar5 = std::__cxx11::string::compare
                                    ((char *)(local_e8._M_allocated_capacity + lVar17));
                  if (iVar5 == 0) {
                    uVar12 = uVar12 + 1;
                    if ((long)(local_e8._8_8_ - local_e8._0_8_) >> 5 == (ulong)uVar12) {
                      local_108._M_unused._M_object = &stack0xffffffffffffff08;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_108,"missing required argument for \"VALIDATOR\"",
                                 "");
                      cmFindCommon::SetError(local_c8,(string *)&local_108);
                      goto LAB_005aae92;
                    }
                    this_02 = cmMakefile::GetState((this_03->super_cmFindCommon).Makefile);
                    local_98 = (ulong)uVar12 * 0x20;
                    cmState::GetCommand((Command *)&local_108,this_02,
                                        (string *)(local_e8._M_allocated_capacity + local_98));
                    if ((code *)in_stack_ffffffffffffff08._M_p == (code *)0x0) {
                      local_88._M_dataplus._M_p._0_1_ = 0x2e;
                      cmStrCat<char_const(&)[49],std::__cxx11::string&,char>
                                ((string *)local_c0,
                                 (char (*) [49])"command specified for \"VALIDATOR\" is undefined: "
                                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(local_98 + local_e8._M_allocated_capacity),(char *)&local_88);
                      cmFindCommon::SetError(local_c8,(string *)local_c0);
                      if ((pointer)local_c0._0_8_ != (pointer)(local_c0 + 0x10)) {
                        operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
                      }
                      if ((code *)in_stack_ffffffffffffff08._M_p != (code *)0x0) {
                        (*(code *)in_stack_ffffffffffffff08._M_p)(&local_108,&local_108,3);
                      }
                      goto LAB_005aaea8;
                    }
                    __pred.validatorName = (value_type *)(local_e8._M_allocated_capacity + local_98)
                    ;
                    this_01 = (this_03->super_cmFindCommon).Makefile;
                    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"MACROS","")
                    ;
                    psVar7 = (string *)cmMakefile::GetProperty(this_01,&local_88);
                    if (psVar7 == (string *)0x0) {
                      psVar7 = &cmValue::Empty_abi_cxx11_;
                    }
                    local_c0._0_8_ = local_c0 + 0x10;
                    pcVar1 = (psVar7->_M_dataplus)._M_p;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)local_c0,pcVar1,pcVar1 + psVar7->_M_string_length);
                    init._M_len = 1;
                    init._M_array = (iterator)local_c0;
                    cmList::cmList(&local_48,init);
                    if ((pointer)local_c0._0_8_ != (pointer)(local_c0 + 0x10)) {
                      operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_88._M_dataplus._M_p != &local_88.field_2) {
                      operator_delete(local_88._M_dataplus._M_p,
                                      local_88.field_2._M_allocated_capacity + 1);
                    }
                    _Var8 = std::
                            find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmFindBase::ParseArguments(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__0>
                                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        )local_48.Values.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start,
                                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        )local_48.Values.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish,__pred);
                    local_68 = local_48.Values.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                    if (_Var8._M_current ==
                        local_48.Values.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) {
                      std::__cxx11::string::_M_assign(local_50);
                    }
                    else {
                      local_88._M_dataplus._M_p._0_1_ = 0x2e;
                      cmStrCat<char_const(&)[54],std::__cxx11::string&,char>
                                ((string *)local_c0,
                                 (char (*) [54])
                                 "command specified for \"VALIDATOR\" is not a function: ",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(local_98 + local_e8._M_allocated_capacity),(char *)&local_88);
                      cmFindCommon::SetError(local_c8,(string *)local_c0);
                      if ((pointer)local_c0._0_8_ != (pointer)(local_c0 + 0x10)) {
                        operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
                      }
                    }
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector(&local_48.Values);
                    if ((code *)in_stack_ffffffffffffff08._M_p != (code *)0x0) {
                      (*(code *)in_stack_ffffffffffffff08._M_p)(&local_108,&local_108,3);
                    }
                    this_03 = local_90;
                    if (_Var8._M_current != local_68) goto LAB_005aaea8;
                  }
                  else {
                    bVar4 = cmFindCommon::CheckCommonArgument
                                      (local_c8,(string *)(local_e8._M_allocated_capacity + lVar17))
                    ;
                    if (bVar4) goto LAB_005ab100;
                    switch(uVar16) {
                    case 1:
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::push_back(local_60,(value_type *)(lVar17 + local_e8._M_allocated_capacity));
                      uVar16 = 1;
                      break;
                    case 2:
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::push_back(local_58,(value_type *)(lVar17 + local_e8._M_allocated_capacity));
                      uVar16 = 2;
                      break;
                    case 3:
                      cmFindCommon::AddPathSuffix
                                (local_c8,(string *)(lVar17 + local_e8._M_allocated_capacity));
                      uVar16 = 3;
                      break;
                    case 4:
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::push_back(&local_c8->UserHintsArgs,
                                  (value_type *)(lVar17 + local_e8._M_allocated_capacity));
                      uVar16 = 4;
                    }
                  }
                }
              }
            }
            uVar15 = (ulong)(uVar12 + 1);
          } while (uVar15 < (ulong)((long)(local_e8._8_8_ - local_e8._0_8_) >> 5));
        }
        if ((this_03->VariableDocumentation)._M_string_length == 0) {
          std::__cxx11::string::_M_replace((ulong)local_a0,0,(char *)0x0,0x86a20a);
          __rhs = (this_03->Names).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
          pbVar2 = (this_03->Names).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (__rhs == pbVar2) {
            std::__cxx11::string::append((char *)local_a0);
          }
          else {
            if ((long)pbVar2 - (long)__rhs == 0x20) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_c0,"the ",__rhs);
              plVar9 = (long *)std::__cxx11::string::append(local_c0);
              local_108._M_unused._M_object = &stack0xffffffffffffff08;
              pvVar10 = (value_type *)(plVar9 + 2);
              if ((value_type *)*plVar9 == pvVar10) {
                _Var18._M_p = (pvVar10->_M_dataplus)._M_p;
              }
              else {
                _Var18._M_p = (pvVar10->_M_dataplus)._M_p;
                local_108._M_unused._M_object = (value_type *)*plVar9;
              }
              local_108._8_8_ = plVar9[1];
              *plVar9 = (long)pvVar10;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              std::__cxx11::string::_M_append
                        ((char *)local_a0,local_108._M_unused._M_member_pointer);
            }
            else {
              std::__cxx11::string::append((char *)local_a0);
              local_c0._0_8_ =
                   (this_03->Names).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_c0._8_8_ =
                   (this_03->Names).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1;
              separator._M_str = ", ";
              separator._M_len = 2;
              cmJoin((string *)&local_108,(cmStringRange *)local_c0,separator,
                     (string_view)ZEXT816(0));
              std::__cxx11::string::_M_append
                        ((char *)local_a0,local_108._M_unused._M_member_pointer);
              if ((value_type *)local_108._M_unused._0_8_ != (value_type *)&stack0xffffffffffffff08)
              {
                operator_delete(local_108._M_unused._M_object,
                                (ulong)(in_stack_ffffffffffffff08._M_p + 1));
              }
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_c0," or ",
                             (this_03->Names).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + -1);
              plVar9 = (long *)std::__cxx11::string::append(local_c0);
              pvVar10 = (value_type *)(plVar9 + 2);
              if ((value_type *)*plVar9 == pvVar10) {
                _Var18._M_p = (pvVar10->_M_dataplus)._M_p;
                local_108._M_unused._M_object = (value_type *)&stack0xffffffffffffff08;
              }
              else {
                _Var18._M_p = (pvVar10->_M_dataplus)._M_p;
                local_108._M_unused._M_object = (value_type *)*plVar9;
              }
              local_108._8_8_ = plVar9[1];
              *plVar9 = (long)pvVar10;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              std::__cxx11::string::_M_append
                        ((char *)local_a0,local_108._M_unused._M_member_pointer);
            }
            if ((value_type *)local_108._M_unused._0_8_ != (value_type *)&stack0xffffffffffffff08) {
              operator_delete(local_108._M_unused._M_object,(ulong)(_Var18._M_p + 1));
            }
            if ((pointer)local_c0._0_8_ != (pointer)(local_c0 + 0x10)) {
              operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
            }
          }
        }
        if ((!bVar3) &&
           ((this_03->Names).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (this_03->Names).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)) {
          __x = &this_03->Names;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_108,__x);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_erase_at_end(__x,(__x->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(__x,(value_type *)local_108._M_unused._0_8_);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &(this_03->super_cmFindCommon).UserGuessArgs,
                     (this_03->super_cmFindCommon).UserGuessArgs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     (value_type *)(local_108._M_unused._M_function_pointer + 0x20),local_108._8_8_)
          ;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_108);
        }
        ExpandPaths(this_03);
        bVar3 = true;
        cmFindCommon::ComputeFinalPaths(local_c8,Yes);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_e8);
  }
  return bVar3;
}

Assistant:

bool cmFindBase::ParseArguments(std::vector<std::string> const& argsIn)
{
  if (argsIn.size() < 2) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  // copy argsIn into args so it can be modified,
  // in the process extract the DOC "documentation"
  // and handle options NO_CACHE and ENV
  size_t size = argsIn.size();
  std::vector<std::string> args;
  bool foundDoc = false;
  for (unsigned int j = 0; j < size; ++j) {
    if (foundDoc || argsIn[j] != "DOC") {
      if (argsIn[j] == "NO_CACHE") {
        this->StoreResultInCache = false;
      } else if (argsIn[j] == "ENV") {
        if (j + 1 < size) {
          j++;
          cmSystemTools::GetPath(args, argsIn[j].c_str());
        }
      } else {
        args.push_back(argsIn[j]);
      }
    } else {
      if (j + 1 < size) {
        foundDoc = true;
        this->VariableDocumentation = argsIn[j + 1];
        j++;
        if (j >= size) {
          break;
        }
      }
    }
  }
  if (args.size() < 2) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  this->VariableName = args[0];
  if (this->CheckForVariableDefined()) {
    this->AlreadyDefined = true;
    return true;
  }

  // Find what search path locations have been enabled/disable
  this->SelectDefaultSearchModes();

  // Find the current root path mode.
  this->SelectDefaultRootPathMode();

  // Find the current bundle/framework search policy.
  this->SelectDefaultMacMode();

  bool newStyle = false;
  enum Doing
  {
    DoingNone,
    DoingNames,
    DoingPaths,
    DoingPathSuffixes,
    DoingHints
  };
  Doing doing = DoingNames; // assume it starts with a name
  for (unsigned int j = 1; j < args.size(); ++j) {
    if (args[j] == "NAMES") {
      doing = DoingNames;
      newStyle = true;
    } else if (args[j] == "PATHS") {
      doing = DoingPaths;
      newStyle = true;
    } else if (args[j] == "HINTS") {
      doing = DoingHints;
      newStyle = true;
    } else if (args[j] == "PATH_SUFFIXES") {
      doing = DoingPathSuffixes;
      newStyle = true;
    } else if (args[j] == "NAMES_PER_DIR") {
      doing = DoingNone;
      if (this->NamesPerDirAllowed) {
        this->NamesPerDir = true;
      } else {
        this->SetError("does not support NAMES_PER_DIR");
        return false;
      }
    } else if (args[j] == "NO_SYSTEM_PATH") {
      doing = DoingNone;
      this->NoDefaultPath = true;
    } else if (args[j] == "REQUIRED") {
      doing = DoingNone;
      this->Required = true;
      newStyle = true;
    } else if (args[j] == "REGISTRY_VIEW") {
      if (++j == args.size()) {
        this->SetError("missing required argument for \"REGISTRY_VIEW\"");
        return false;
      }
      auto view = cmWindowsRegistry::ToView(args[j]);
      if (view) {
        this->RegistryView = *view;
      } else {
        this->SetError(
          cmStrCat("given invalid value for \"REGISTRY_VIEW\": ", args[j]));
        return false;
      }
    } else if (args[j] == "VALIDATOR") {
      if (++j == args.size()) {
        this->SetError("missing required argument for \"VALIDATOR\"");
        return false;
      }
      auto command = this->Makefile->GetState()->GetCommand(args[j]);
      if (command == nullptr) {
        this->SetError(cmStrCat(
          "command specified for \"VALIDATOR\" is undefined: ", args[j], '.'));
        return false;
      }
      // ensure a macro is not specified as validator
      const auto& validatorName = args[j];
      cmList macros{ this->Makefile->GetProperty("MACROS") };
      if (std::find_if(macros.begin(), macros.end(),
                       [&validatorName](const std::string& item) {
                         return cmSystemTools::Strucmp(validatorName.c_str(),
                                                       item.c_str()) == 0;
                       }) != macros.end()) {
        this->SetError(cmStrCat(
          "command specified for \"VALIDATOR\" is not a function: ", args[j],
          '.'));
        return false;
      }
      this->ValidatorName = args[j];
    } else if (this->CheckCommonArgument(args[j])) {
      doing = DoingNone;
    } else {
      // Some common arguments were accidentally supported by CMake
      // 2.4 and 2.6.0 in the short-hand form of the command, so we
      // must support it even though it is not documented.
      if (doing == DoingNames) {
        this->Names.push_back(args[j]);
      } else if (doing == DoingPaths) {
        this->UserGuessArgs.push_back(args[j]);
      } else if (doing == DoingHints) {
        this->UserHintsArgs.push_back(args[j]);
      } else if (doing == DoingPathSuffixes) {
        this->AddPathSuffix(args[j]);
      }
    }
  }

  if (this->VariableDocumentation.empty()) {
    this->VariableDocumentation = "Where can ";
    if (this->Names.empty()) {
      this->VariableDocumentation += "the (unknown) library be found";
    } else if (this->Names.size() == 1) {
      this->VariableDocumentation +=
        "the " + this->Names.front() + " library be found";
    } else {
      this->VariableDocumentation += "one of the ";
      this->VariableDocumentation +=
        cmJoin(cmMakeRange(this->Names).retreat(1), ", ");
      this->VariableDocumentation +=
        " or " + this->Names.back() + " libraries be found";
    }
  }

  // look for old style
  // FIND_*(VAR name path1 path2 ...)
  if (!newStyle && !this->Names.empty()) {
    // All the short-hand arguments have been recorded as names.
    std::vector<std::string> shortArgs = this->Names;
    this->Names.clear(); // clear out any values in Names
    this->Names.push_back(shortArgs[0]);
    cm::append(this->UserGuessArgs, shortArgs.begin() + 1, shortArgs.end());
  }
  this->ExpandPaths();

  this->ComputeFinalPaths(IgnorePaths::Yes);

  return true;
}